

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::Operation<double,double,duckdb::MadAccessor<double,double,double>>
          (Interpolator<false> *this,double *v_t,Vector *result,
          MadAccessor<double,_double,_double> *accessor)

{
  idx_t iVar1;
  long lVar2;
  double dVar3;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<double,_double,_double>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<double,_double,_double>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<double,_double,_double>_>_> __comp_01;
  bool bVar4;
  ulong uVar5;
  idx_t iVar6;
  InvalidInputException *pIVar7;
  idx_t iVar8;
  duckdb *pdVar9;
  idx_t iVar10;
  double result_1;
  string local_70;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  bVar4 = this->desc;
  iVar8 = this->CRN;
  iVar10 = this->FRN;
  iVar1 = this->begin;
  iVar6 = this->end;
  local_70._M_dataplus._M_p = (pointer)accessor;
  local_70._M_string_length = (size_type)accessor;
  local_70.field_2._M_local_buf[0] = bVar4;
  if (iVar8 == iVar10) {
    if (iVar8 != iVar6 && iVar1 != iVar6) {
      uVar5 = (long)(iVar6 * 8 + iVar1 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_70.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar4;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<double,double,double>>>>
                (v_t + iVar1,v_t + iVar8,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar8 = this->FRN;
    }
    local_48 = ABS(v_t[iVar8] - *accessor->median);
    uStack_40 = 0;
    pdVar9 = (duckdb *)0x0;
    bVar4 = TryCast::Operation<double,double>(local_48,&local_50,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_70,pdVar9,local_48);
      InvalidInputException::InvalidInputException(pIVar7,&local_70);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar10 != iVar6 && iVar1 != iVar6) {
      uVar5 = (long)(iVar6 * 8 + iVar1 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_70.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar4;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<double,double,double>>>>
                (v_t + iVar1,v_t + iVar10,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar10 = this->FRN;
      iVar8 = this->CRN;
      iVar6 = this->end;
    }
    local_70._M_dataplus._M_p = (pointer)accessor;
    local_70._M_string_length = (size_type)accessor;
    local_70.field_2._M_local_buf[0] = bVar4;
    if (iVar8 != iVar6 && iVar10 != iVar6) {
      uVar5 = (long)(iVar6 * 8 + iVar10 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_70.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar4;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<double,double,double>>>>
                (v_t + iVar10,v_t + iVar8,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar10 = this->FRN;
    }
    local_48 = ABS(v_t[iVar10] - *accessor->median);
    uStack_40 = 0;
    pdVar9 = (duckdb *)0x0;
    bVar4 = TryCast::Operation<double,double>(local_48,&local_50,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_70,pdVar9,local_48);
      InvalidInputException::InvalidInputException(pIVar7,&local_70);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48 = local_50;
    local_38 = ABS(v_t[this->CRN] - *accessor->median);
    uStack_30 = 0;
    pdVar9 = (duckdb *)0x0;
    bVar4 = TryCast::Operation<double,double>(local_38,&local_50,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_70,pdVar9,local_38);
      InvalidInputException::InvalidInputException(pIVar7,&local_70);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dVar3 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_50 = dVar3 * local_50 + local_48 * (1.0 - dVar3);
  }
  return local_50;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}